

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall mpt::slice::trim(slice *this,ssize_t len)

{
  content *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (len < 0) {
    pcVar1 = (this->super_array)._buf._ref;
    if ((pcVar1 == (content *)0x0) || (*(long *)(pcVar1 + 8) != 0)) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ulong *)(pcVar1 + 0x18);
    }
    uVar3 = this->_len;
    if ((this->_off - len) + uVar3 <= uVar2) goto LAB_0012d8b3;
  }
  else {
    uVar3 = this->_len;
    if ((ulong)len <= uVar3) {
LAB_0012d8b3:
      this->_len = uVar3 - len;
      return true;
    }
  }
  return false;
}

Assistant:

bool slice::trim(ssize_t len)
{
	if (len < 0) {
		if (length() < (_off + _len - len)) {
			return false;
		}
	}
	else if ((size_t) len > _len) {
		return false;
	}
	_len -= len;
	return true;
}